

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O2

void pnga_summarize(Integer verbose)

{
  bool bVar1;
  ulong uVar2;
  Integer IVar3;
  ulong proc;
  char *pcVar4;
  long lVar5;
  long local_118;
  Integer ndim;
  Integer local_108;
  ulong local_100;
  char *name;
  Integer type;
  Integer hip [7];
  Integer lop [7];
  Integer dims [7];
  
  local_108 = verbose;
  uVar2 = pnga_nnodes();
  fwrite(" Summary of allocated global arrays\n",0x24,1,_stdout);
  fwrite("-----------------------------------\n",0x24,1,_stdout);
  local_100 = uVar2;
  if ((long)uVar2 < 1) {
    local_100 = 0;
  }
  uVar2 = 0xfffffffffffffc18;
  bVar1 = false;
  local_118 = 0;
  do {
    if (uVar2 == 0xfffffffffffffc7c) {
      if (!bVar1) {
        fwrite("  No active global arrays\n",0x1a,1,_stdout);
      }
      fwrite("\n\n",2,1,_stdout);
      fflush(_stdout);
      return;
    }
    IVar3 = pnga_verify_handle(uVar2);
    if (IVar3 == 1) {
      pnga_inquire(uVar2,&type,&ndim,dims);
      pnga_inquire_name(uVar2,&name);
      switch(type) {
      case 0x3e9:
        pcVar4 = "  array %d => integer ";
        break;
      case 0x3ea:
        pcVar4 = "  array %d => long ";
        break;
      case 0x3eb:
        pcVar4 = "  array %d => float ";
        break;
      case 0x3ec:
        pcVar4 = "  array %d => double precision ";
        break;
      default:
        pnga_error("ga_print: wrong type",0);
        goto LAB_00129831;
      case 0x3ee:
        pcVar4 = "  array %d => float (single) complex ";
        break;
      case 0x3ef:
        pcVar4 = "  array %d => double complex ";
        break;
      case 0x3f8:
        pcVar4 = "  array %d => long long";
      }
      fprintf(_stdout,pcVar4,local_118);
LAB_00129831:
      fprintf(_stdout,"%s(",name);
      for (lVar5 = 0; lVar5 < ndim; lVar5 = lVar5 + 1) {
        pcVar4 = "%ld,";
        if (lVar5 == ndim + -1) {
          pcVar4 = "%ld";
        }
        fprintf(_stdout,pcVar4,dims[lVar5]);
      }
      local_118 = local_118 + 1;
      fprintf(_stdout,"),  handle: %d \n",uVar2 & 0xffffffff);
      if (local_108 != 0) {
        for (proc = 0; proc != local_100; proc = proc + 1) {
          pnga_distribution(uVar2,proc,lop,hip);
          fwrite("    (",5,1,_stdout);
          for (lVar5 = 0; lVar5 < ndim; lVar5 = lVar5 + 1) {
            pcVar4 = "%ld:%ld,";
            if (lVar5 == ndim + -1) {
              pcVar4 = "%ld:%ld";
            }
            fprintf(_stdout,pcVar4,lop[lVar5],hip[lVar5]);
          }
          fprintf(_stdout,") -> %d \n",proc & 0xffffffff);
        }
      }
      bVar1 = true;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void pnga_summarize(Integer verbose)
{
#define DEV stdout
    
    Integer i, j, g_a;
    Integer printed, arr_no;
    Integer type, active;
    char *name;
    Integer ndim, dims[MAXDIM];
    Integer lop[MAXDIM], hip[MAXDIM];
    Integer nproc = pnga_nnodes();
    
    fprintf(DEV, " Summary of allocated global arrays\n");
    fprintf(DEV, "-----------------------------------\n");

    printed = 0;
    arr_no = 0;
    
    for(g_a=-1000; g_a<-900; g_a++) {
        active = pnga_verify_handle(g_a);

        if(active == 1) {
            printed = 1;
            pnga_inquire(g_a, &type, &ndim, dims);
            pnga_inquire_name(g_a, &name);
            
            switch(type) {
                case C_INT:
                    fprintf(DEV, "  array %d => integer ", (int)arr_no);
                    break;
                case C_DBL:
                    fprintf(DEV, "  array %d => double precision ",(int)arr_no);
                    break;
                case C_DCPL:
                    fprintf(DEV, "  array %d => double complex ", (int)arr_no);
                    break;
                case C_SCPL:
                    fprintf(DEV, "  array %d => float (single) complex ", (int)arr_no);
                    break;
                case C_FLOAT:
                    fprintf(DEV, "  array %d => float ",(int)arr_no);
                    break;       
                case C_LONG:
                    fprintf(DEV, "  array %d => long ",(int)arr_no);
                    break;   
                case C_LONGLONG:
                    fprintf(DEV, "  array %d => long long",(int)arr_no);
                    break;   
                default: pnga_error("ga_print: wrong type",0);
            }
            arr_no++;

            fprintf(DEV,"%s(", name);
            for(i=0; i<ndim; i++)
                if(i != (ndim-1)) fprintf(DEV, "%ld,", (long)dims[i]);
                else fprintf(DEV, "%ld", (long)dims[i]);
            fprintf(DEV,"),  handle: %d \n",(int) g_a);

            if(verbose) {
                for(i=0; i<nproc; i++){
                    pnga_distribution(g_a, i, lop, hip);
                    
                    fprintf(DEV,"    (");
                    for(j=0; j<ndim; j++)
                        if(j != (ndim-1))
                            fprintf(DEV, "%ld:%ld,",(long)lop[j], (long)hip[j]);
                        else
                            fprintf(DEV, "%ld:%ld", (long)lop[j], (long)hip[j]);
                    fprintf(DEV,") -> %d \n",(int) i);
                }
            }
        }
    }

    if(!printed) fprintf(DEV, "  No active global arrays\n");

    fprintf(DEV, "\n\n");
    fflush(DEV);
}